

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_log(int iErrCode,char *zFormat,...)

{
  long lVar1;
  char in_AL;
  long in_FS_OFFSET;
  __va_list_tag *in_XMM0_Qa;
  char *in_XMM0_Qb;
  undefined8 in_XMM1_Qa;
  va_list ap;
  __va_list_tag *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  int iErrCode_00;
  
  iErrCode_00 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  if (in_AL != '\0') {
    in_stack_ffffffffffffff48 = in_XMM0_Qa;
    in_stack_ffffffffffffff50 = in_XMM0_Qb;
    iErrCode_00 = (int)((ulong)in_XMM1_Qa >> 0x20);
  }
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (sqlite3Config.xLog != (_func_void_void_ptr_int_char_ptr *)0x0) {
    renderLogMsg(iErrCode_00,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API void sqlite3_log(int iErrCode, const char *zFormat, ...){
  va_list ap;                             /* Vararg list */
  if( sqlite3GlobalConfig.xLog ){
    va_start(ap, zFormat);
    renderLogMsg(iErrCode, zFormat, ap);
    va_end(ap);
  }
}